

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOR<double>_> *this,
          TPZAutoPointer<TPZCompMesh> *cmesh)

{
  TPZAutoPointer<TPZCompMesh> local_10;
  
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x179de68;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x179df30;
  *(undefined4 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xf0 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xf4 = 1;
  local_10 = (TPZAutoPointer<TPZCompMesh>)cmesh->fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (&this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,
             &PTR_construction_vtable_104__0179d4c0,&local_10);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_10);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x179d448;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x179d280;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x179d348;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZAutoPointer<TPZCompMesh> cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}